

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDeprecated.cpp
# Opt level: O2

HighsStatus __thiscall Highs::getHighsOptionType(Highs *this,string *option,HighsOptionType *type)

{
  HighsStatus HVar1;
  allocator local_5a;
  allocator local_59;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"getHighsOptionType",&local_59);
  std::__cxx11::string::string((string *)&local_58,"getOptionType",&local_5a);
  deprecationMessage(this,&local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  HVar1 = getOptionType(this,option,type);
  return HVar1;
}

Assistant:

HighsStatus Highs::getHighsOptionType(const std::string& option,
                                      HighsOptionType& type) {
  deprecationMessage("getHighsOptionType", "getOptionType");
  return getOptionType(option, type);
}